

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DTDScanner::getQuotedString(DTDScanner *this,XMLBuffer *toFill)

{
  bool bVar1;
  XMLCh toAppend;
  XMLCh local_22;
  XMLCh nextCh;
  XMLBuffer *pXStack_20;
  XMLCh quoteCh;
  XMLBuffer *toFill_local;
  DTDScanner *this_local;
  
  pXStack_20 = toFill;
  toFill_local = (XMLBuffer *)this;
  XMLBuffer::reset(toFill);
  bVar1 = ReaderMgr::skipIfQuote(this->fReaderMgr,&local_22);
  if (bVar1) {
    while (toAppend = ReaderMgr::getNextChar(this->fReaderMgr), toAppend != local_22) {
      if (toAppend == L'\0') {
        return false;
      }
      XMLBuffer::append(pXStack_20,toAppend);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DTDScanner::getQuotedString(XMLBuffer& toFill)
{
    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

	XMLCh nextCh;
    // Get another char and see if it matches the starting quote char
    while ((nextCh=fReaderMgr->getNextChar())!=quoteCh)
    {
        //
        //  We should never get either an end of file null char here. If we
        //  do, just fail. It will be handled more gracefully in the higher
        //  level code that called us.
        //
        if (!nextCh)
            return false;

        // Else add it to the buffer
        toFill.append(nextCh);
    }
    return true;
}